

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

int mixed_buffer_copy(mixed_buffer *from,mixed_buffer *to)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  uint32_t samples;
  float *write;
  float *read;
  uint32_t local_34;
  float *local_30;
  float *local_28;
  
  mixed_err(0);
  if (from != to) {
    local_34 = 0xffffffff;
    mixed_buffer_request_read(&local_28,&local_34,from);
    mixed_buffer_request_write(&local_30,&local_34,to);
    uVar2 = local_34;
    memcpy(local_30,local_28,(ulong)local_34 << 2);
    if (to->reserved < uVar2) {
      mixed_err(0x12);
    }
    else {
      do {
        uVar1 = to->write;
        LOCK();
        bVar3 = uVar1 == to->write;
        if (bVar3) {
          to->write = uVar1 + uVar2;
        }
        UNLOCK();
      } while (!bVar3);
      to->reserved = 0;
    }
  }
  return 1;
}

Assistant:

MIXED_EXPORT int mixed_buffer_copy(struct mixed_buffer *from, struct mixed_buffer *to){
  mixed_err(MIXED_NO_ERROR);
  if(from != to){
    float *restrict read, *restrict write;
    uint32_t samples = UINT32_MAX;
    mixed_buffer_request_read(&read, &samples, from);
    mixed_buffer_request_write(&write, &samples, to);
    memcpy(write, read, sizeof(float)*samples);
    mixed_buffer_finish_write(samples, to);
  }
  return 1;
}